

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_internal_V2_annotation.cpp
# Opt level: O1

ON_Object * __thiscall ON_OBSOLETE_V5_DimExtra::Internal_DeepCopy(ON_OBSOLETE_V5_DimExtra *this)

{
  ON_UserData *this_00;
  long lVar1;
  ON_UUID *pOVar2;
  ON_UserData *pOVar3;
  byte bVar4;
  
  bVar4 = 0;
  this_00 = (ON_UserData *)operator_new(0x118);
  ON_UserData::ON_UserData(this_00,&this->super_ON_UserData);
  (this_00->super_ON_Object)._vptr_ON_Object = (_func_int **)&PTR_ClassId_0081f8c8;
  pOVar2 = &this->m_partent_uuid;
  pOVar3 = this_00 + 1;
  for (lVar1 = 10; lVar1 != 0; lVar1 = lVar1 + -1) {
    (pOVar3->super_ON_Object)._vptr_ON_Object = *(_func_int ***)pOVar2;
    pOVar2 = (ON_UUID *)pOVar2[-(ulong)bVar4].Data4;
    pOVar3 = (ON_UserData *)((long)pOVar3 + (ulong)bVar4 * -0x10 + 8);
  }
  return &this_00->super_ON_Object;
}

Assistant:

ON_OBSOLETE_V5_DimExtra::ON_OBSOLETE_V5_DimExtra()
{
  m_userdata_uuid = ON_CLASS_ID(ON_OBSOLETE_V5_DimExtra);
  m_application_uuid = ON_opennurbs5_id; // opennurbs.dll reads/writes this userdata
                                         // The id must be the version 5 id because
                                         // V6 SaveAs V5 needs to work, but SaveAs
                                         // V4 should not write this userdata.
  m_userdata_copycount = 1;
  SetDefaults();
}